

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestUtils.cpp
# Opt level: O2

SpatialInertia * iDynTree::getRandomInertia(void)

{
  SpatialInertia *in_RDI;
  double dVar1;
  double dVar2;
  double dVar3;
  double z;
  Position local_160;
  double local_148 [5];
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  double local_108;
  RotationalInertia local_100;
  RotationalInertia local_b8;
  Rotation rot;
  
  dVar1 = getRandomDouble(0.0,3.0);
  dVar2 = getRandomDouble(0.0,4.0);
  local_148[4] = getRandomDouble(0.0,6.0);
  local_148[0] = dVar2 + local_148[4];
  local_148[4] = local_148[4] + dVar1;
  local_148[3] = 0.0;
  local_148[1] = 0.0;
  local_148[2] = 0.0;
  local_108 = dVar1 + dVar2;
  local_120 = 0;
  uStack_118 = 0;
  local_110 = 0;
  dVar1 = getRandomDouble(0.0,1.0);
  dVar2 = getRandomDouble(-1.0,1.0);
  dVar3 = getRandomDouble(0.0,1.0);
  Rotation::RPY(&rot,dVar1,dVar2,dVar3);
  dVar1 = getRandomDouble(0.0,4.0);
  dVar2 = getRandomDouble(-2.0,2.0);
  dVar3 = getRandomDouble(-2.0,2.0);
  z = getRandomDouble(-2.0,2.0);
  Position::Position(&local_160,dVar2,dVar3,z);
  RotationalInertia::RotationalInertia(&local_100,local_148,3,3);
  Rotation::operator*(&local_b8,&rot,&local_100);
  SpatialInertia::SpatialInertia(in_RDI,dVar1,&local_160,&local_b8);
  return in_RDI;
}

Assistant:

SpatialInertia getRandomInertia()
{
    double cxx = getRandomDouble(0,3);
    double cyy = getRandomDouble(0,4);
    double czz = getRandomDouble(0,6);
    double rotInertiaData[3*3] = {czz+cyy,0.0,0.0,
                                  0.0,cxx+czz,0.0,
                                  0.0,0.0,cxx+cyy};

    Rotation rot = Rotation::RPY(getRandomDouble(),getRandomDouble(-1,1),getRandomDouble());

    SpatialInertia inertiaLink(getRandomDouble(0,4),
                               Position(getRandomDouble(-2,2),getRandomDouble(-2,2),getRandomDouble(-2,2)),
                               rot*RotationalInertia(rotInertiaData,3,3));

    return inertiaLink;
}